

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolARP.cpp
# Opt level: O0

bool __thiscall ProtocolARP::IsLocal(ProtocolARP *this,uint8_t *protocolAddress)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  size_t sVar4;
  uint8_t *puVar5;
  uint local_1c;
  uint32_t i;
  uint8_t *protocolAddress_local;
  ProtocolARP *this_local;
  
  for (local_1c = 0; sVar4 = ProtocolIPv4::AddressSize(this->IP), local_1c < sVar4;
      local_1c = local_1c + 1) {
    bVar1 = protocolAddress[local_1c];
    puVar5 = ProtocolIPv4::GetSubnetMask(this->IP);
    bVar2 = puVar5[local_1c];
    puVar5 = ProtocolIPv4::GetUnicastAddress(this->IP);
    bVar3 = puVar5[local_1c];
    puVar5 = ProtocolIPv4::GetSubnetMask(this->IP);
    if ((bVar1 & bVar2) != (bVar3 & puVar5[local_1c])) break;
  }
  sVar4 = ProtocolIPv4::AddressSize(this->IP);
  return local_1c == sVar4;
}

Assistant:

bool ProtocolARP::IsLocal(const uint8_t* protocolAddress)
{
    uint32_t i;

    for (i = 0; i < IP.AddressSize(); i++)
    {
        if ((protocolAddress[i] & IP.GetSubnetMask()[i]) !=
            (IP.GetUnicastAddress()[i] & IP.GetSubnetMask()[i]))
        {
            break;
        }
    }

    return i == IP.AddressSize();
}